

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qcombobox.cpp
# Opt level: O0

void __thiscall QComboBox::showEvent(QComboBox *this,QShowEvent *e)

{
  long lVar1;
  QComboBoxPrivate *pQVar2;
  QShowEvent *in_RSI;
  QWidget *in_RDI;
  long in_FS_OFFSET;
  QComboBoxPrivate *d;
  QSize local_10;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  pQVar2 = d_func((QComboBox *)0x53c64f);
  if (((pQVar2->field_0x34c & 1) == 0) && (pQVar2->sizeAdjustPolicy == AdjustToContentsOnFirstShow))
  {
    QSize::QSize((QSize *)in_RDI);
    pQVar2->sizeHint = local_10;
    QWidget::updateGeometry(in_RDI);
  }
  pQVar2->field_0x34c = pQVar2->field_0x34c | 1;
  QWidget::showEvent(in_RDI,in_RSI);
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void QComboBox::showEvent(QShowEvent *e)
{
    Q_D(QComboBox);
    if (!d->shownOnce && d->sizeAdjustPolicy == QComboBox::AdjustToContentsOnFirstShow) {
        d->sizeHint = QSize();
        updateGeometry();
    }
    d->shownOnce = true;
    QWidget::showEvent(e);
}